

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadHuffmanCodes(VP8LDecoder *dec,int xsize,int ysize,int color_cache_bits,int allow_recursion)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int xsize_00;
  uint uVar4;
  int iVar5;
  int *piVar6;
  HuffmanCode *table;
  HuffmanCode *pHVar7;
  HTreeGroup *pHVar8;
  HTreeGroup *pHVar9;
  int in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  int alpha;
  int blue;
  int red;
  int k;
  int local_max_bits;
  int alphabet_size_2;
  int max_bits;
  int is_trivial_literal;
  int total_size;
  int size;
  HuffmanCode **htrees;
  HTreeGroup *htree_group;
  int alphabet_size_1;
  int alphabet_size;
  int *mapped_group;
  int group;
  int huffman_pixs;
  int huffman_ysize;
  int huffman_xsize;
  int huffman_precision;
  int ok;
  int *mapping;
  int table_size;
  int *code_lengths;
  int max_alphabet_size;
  int num_htree_groups_max;
  int num_htree_groups;
  HuffmanCode *huffman_table;
  HuffmanCode *huffman_tables;
  HTreeGroup *htree_groups;
  uint32_t *huffman_image;
  VP8LMetadata *hdr;
  VP8LBitReader *br;
  int j;
  int i;
  bool local_e5;
  int in_stack_ffffffffffffff1c;
  size_t in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  HuffmanCode local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  int local_b8;
  uint32_t **in_stack_ffffffffffffff58;
  HTreeGroup *pHVar10;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int local_7c;
  void *local_78;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar11;
  int iVar12;
  int iVar13;
  HuffmanCode *pHVar14;
  int local_20;
  int local_1c;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  iVar13 = 1;
  iVar12 = 1;
  uVar11 = 0;
  local_78 = (void *)0x0;
  local_7c = 0;
  if ((in_R8D != 0) &&
     (uVar1 = VP8LReadBits((VP8LBitReader *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (int)(in_stack_ffffffffffffff20 >> 0x20)), uVar1 != 0)) {
    uVar1 = VP8LReadBits((VP8LBitReader *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (int)(in_stack_ffffffffffffff20 >> 0x20));
    uVar1 = uVar1 + 2;
    uVar2 = VP8LSubSampleSize(in_ESI,uVar1);
    uVar3 = VP8LSubSampleSize(in_EDX,uVar1);
    xsize_00 = uVar2 * uVar3;
    iVar13 = DecodeImageStream(xsize_00,in_stack_ffffffffffffff70,iVar5,
                               (VP8LDecoder *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58);
    if (iVar13 == 0) goto LAB_0011ad75;
    in_RDI[0x31] = uVar1;
    for (local_1c = 0; local_1c < xsize_00; local_1c = local_1c + 1) {
      uVar4 = *(uint *)((long)local_1c * 4) >> 8 & 0xffff;
      *(uint *)((long)local_1c * 4) = uVar4;
      if (iVar12 <= (int)uVar4) {
        iVar12 = uVar4 + 1;
      }
    }
    if ((1000 < iVar12) || (iVar13 = iVar12, (int)(in_ESI * in_EDX) < iVar12)) {
      local_78 = WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                in_stack_ffffffffffffff20);
      if (local_78 == (void *)0x0) {
        *in_RDI = 1;
        goto LAB_0011ad75;
      }
      memset(local_78,0xff,(long)iVar12 << 2);
      iVar13 = 0;
      for (local_1c = 0; local_1c < xsize_00; local_1c = local_1c + 1) {
        piVar6 = (int *)((long)local_78 + (ulong)*(uint *)((long)local_1c * 4) * 4);
        iVar5 = iVar13;
        if (*piVar6 == -1) {
          iVar5 = iVar13 + 1;
          *piVar6 = iVar13;
        }
        *(int *)((long)local_1c * 4) = *piVar6;
        iVar13 = iVar5;
      }
    }
  }
  if (in_RDI[0x13] == 0) {
    for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
      uVar4 = (uint)kAlphabetSize[local_20];
      if ((local_20 == 0) && (0 < in_ECX)) {
        uVar4 = (1 << ((byte)in_ECX & 0x1f)) + uVar4;
      }
      if ((int)uVar11 < (int)uVar4) {
        uVar11 = uVar4;
      }
    }
    table = (HuffmanCode *)
            WebPSafeCalloc(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff20);
    pHVar7 = (HuffmanCode *)
             WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            in_stack_ffffffffffffff20);
    pHVar8 = VP8LHtreeGroupsNew(in_stack_ffffffffffffff1c);
    if (((pHVar8 == (HTreeGroup *)0x0) || (table == (HuffmanCode *)0x0)) ||
       (pHVar7 == (HuffmanCode *)0x0)) {
      *in_RDI = 1;
    }
    else {
      pHVar14 = pHVar7;
      for (local_1c = 0; local_1c < iVar12; local_1c = local_1c + 1) {
        if ((local_78 == (void *)0x0) || (*(int *)((long)local_78 + (long)local_1c * 4) != -1)) {
          iVar5 = local_1c;
          if (local_78 != (void *)0x0) {
            iVar5 = *(int *)((long)local_78 + (long)local_1c * 4);
          }
          pHVar9 = pHVar8 + iVar5;
          local_b8 = 0;
          local_bc = 1;
          local_c0 = 0;
          pHVar10 = pHVar9;
          for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
            local_c4 = (uint)kAlphabetSize[local_20];
            pHVar9->htrees[local_20] = pHVar14;
            if ((local_20 == 0) && (0 < in_ECX)) {
              local_c4 = (1 << ((byte)in_ECX & 0x1f)) + local_c4;
            }
            iVar5 = ReadHuffmanCode((int)pHVar14,(VP8LDecoder *)CONCAT44(iVar13,iVar12),
                                    (int *)CONCAT44(uVar11,in_stack_ffffffffffffffa0),table);
            if (iVar5 == 0) goto LAB_0011ad75;
            if ((local_bc != 0) && (""[local_20] == '\x01')) {
              local_bc = (uint)(pHVar14->bits == '\0');
            }
            local_b8 = (uint)pHVar14->bits + local_b8;
            pHVar14 = pHVar14 + iVar5;
            if (local_20 < 4) {
              local_c8 = *table;
              for (in_stack_ffffffffffffff34 = 1; in_stack_ffffffffffffff34 < (int)local_c4;
                  in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 1) {
                if ((int)local_c8 < (int)table[in_stack_ffffffffffffff34]) {
                  local_c8 = table[in_stack_ffffffffffffff34];
                }
              }
              local_c0 = (int)local_c8 + local_c0;
            }
          }
          pHVar10->is_trivial_literal = local_bc;
          pHVar10->is_trivial_code = 0;
          if (local_bc != 0) {
            in_stack_ffffffffffffff30 = (uint)pHVar9->htrees[1]->value;
            pHVar10->literal_arb =
                 (uint)pHVar9->htrees[3]->value << 0x18 | in_stack_ffffffffffffff30 << 0x10 |
                 (uint)pHVar9->htrees[2]->value;
            if ((local_b8 == 0) && (pHVar9->htrees[0]->value < 0x100)) {
              pHVar10->is_trivial_code = 1;
              pHVar10->literal_arb = (uint)pHVar9->htrees[0]->value << 8 | pHVar10->literal_arb;
            }
          }
          local_e5 = pHVar10->is_trivial_code == 0 && local_c0 < 6;
          pHVar10->use_packed_table = (uint)local_e5;
          if (pHVar10->use_packed_table != 0) {
            BuildPackedTable((HTreeGroup *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          }
        }
        else {
          for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
            iVar5 = ReadHuffmanCode((int)pHVar14,(VP8LDecoder *)CONCAT44(iVar13,iVar12),
                                    (int *)CONCAT44(uVar11,in_stack_ffffffffffffffa0),table);
            if (iVar5 == 0) goto LAB_0011ad75;
          }
        }
      }
      local_7c = 1;
      *(undefined8 *)(in_RDI + 0x34) = 0;
      in_RDI[0x36] = iVar13;
      *(HTreeGroup **)(in_RDI + 0x38) = pHVar8;
      *(HuffmanCode **)(in_RDI + 0x3a) = pHVar7;
    }
  }
LAB_0011ad75:
  WebPSafeFree((void *)0x11ad82);
  WebPSafeFree((void *)0x11ad8c);
  if (local_7c == 0) {
    WebPSafeFree((void *)0x11ada0);
    WebPSafeFree((void *)0x11adad);
    VP8LHtreeGroupsFree((HTreeGroup *)0x11adba);
  }
  return local_7c;
}

Assistant:

static int ReadHuffmanCodes(VP8LDecoder* const dec, int xsize, int ysize,
                            int color_cache_bits, int allow_recursion) {
  int i, j;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* huffman_image = NULL;
  HTreeGroup* htree_groups = NULL;
  HuffmanCode* huffman_tables = NULL;
  HuffmanCode* huffman_table = NULL;
  int num_htree_groups = 1;
  int num_htree_groups_max = 1;
  int max_alphabet_size = 0;
  int* code_lengths = NULL;
  const int table_size = kTableSize[color_cache_bits];
  int* mapping = NULL;
  int ok = 0;

  if (allow_recursion && VP8LReadBits(br, 1)) {
    // use meta Huffman codes.
    const int huffman_precision = VP8LReadBits(br, 3) + 2;
    const int huffman_xsize = VP8LSubSampleSize(xsize, huffman_precision);
    const int huffman_ysize = VP8LSubSampleSize(ysize, huffman_precision);
    const int huffman_pixs = huffman_xsize * huffman_ysize;
    if (!DecodeImageStream(huffman_xsize, huffman_ysize, 0, dec,
                           &huffman_image)) {
      goto Error;
    }
    hdr->huffman_subsample_bits_ = huffman_precision;
    for (i = 0; i < huffman_pixs; ++i) {
      // The huffman data is stored in red and green bytes.
      const int group = (huffman_image[i] >> 8) & 0xffff;
      huffman_image[i] = group;
      if (group >= num_htree_groups_max) {
        num_htree_groups_max = group + 1;
      }
    }
    // Check the validity of num_htree_groups_max. If it seems too big, use a
    // smaller value for later. This will prevent big memory allocations to end
    // up with a bad bitstream anyway.
    // The value of 1000 is totally arbitrary. We know that num_htree_groups_max
    // is smaller than (1 << 16) and should be smaller than the number of pixels
    // (though the format allows it to be bigger).
    if (num_htree_groups_max > 1000 || num_htree_groups_max > xsize * ysize) {
      // Create a mapping from the used indices to the minimal set of used
      // values [0, num_htree_groups)
      mapping = (int*)WebPSafeMalloc(num_htree_groups_max, sizeof(*mapping));
      if (mapping == NULL) {
        dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
        goto Error;
      }
      // -1 means a value is unmapped, and therefore unused in the Huffman
      // image.
      memset(mapping, 0xff, num_htree_groups_max * sizeof(*mapping));
      for (num_htree_groups = 0, i = 0; i < huffman_pixs; ++i) {
        // Get the current mapping for the group and remap the Huffman image.
        int* const mapped_group = &mapping[huffman_image[i]];
        if (*mapped_group == -1) *mapped_group = num_htree_groups++;
        huffman_image[i] = *mapped_group;
      }
    } else {
      num_htree_groups = num_htree_groups_max;
    }
  }

  if (br->eos_) goto Error;

  // Find maximum alphabet size for the htree group.
  for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
    int alphabet_size = kAlphabetSize[j];
    if (j == 0 && color_cache_bits > 0) {
      alphabet_size += 1 << color_cache_bits;
    }
    if (max_alphabet_size < alphabet_size) {
      max_alphabet_size = alphabet_size;
    }
  }

  code_lengths = (int*)WebPSafeCalloc((uint64_t)max_alphabet_size,
                                      sizeof(*code_lengths));
  huffman_tables = (HuffmanCode*)WebPSafeMalloc(num_htree_groups * table_size,
                                                sizeof(*huffman_tables));
  htree_groups = VP8LHtreeGroupsNew(num_htree_groups);

  if (htree_groups == NULL || code_lengths == NULL || huffman_tables == NULL) {
    dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    goto Error;
  }

  huffman_table = huffman_tables;
  for (i = 0; i < num_htree_groups_max; ++i) {
    // If the index "i" is unused in the Huffman image, just make sure the
    // coefficients are valid but do not store them.
    if (mapping != NULL && mapping[i] == -1) {
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        // Passing in NULL so that nothing gets filled.
        if (!ReadHuffmanCode(alphabet_size, dec, code_lengths, NULL)) {
          goto Error;
        }
      }
    } else {
      HTreeGroup* const htree_group =
          &htree_groups[(mapping == NULL) ? i : mapping[i]];
      HuffmanCode** const htrees = htree_group->htrees;
      int size;
      int total_size = 0;
      int is_trivial_literal = 1;
      int max_bits = 0;
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        htrees[j] = huffman_table;
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        size = ReadHuffmanCode(alphabet_size, dec, code_lengths, huffman_table);
        if (size == 0) {
          goto Error;
        }
        if (is_trivial_literal && kLiteralMap[j] == 1) {
          is_trivial_literal = (huffman_table->bits == 0);
        }
        total_size += huffman_table->bits;
        huffman_table += size;
        if (j <= ALPHA) {
          int local_max_bits = code_lengths[0];
          int k;
          for (k = 1; k < alphabet_size; ++k) {
            if (code_lengths[k] > local_max_bits) {
              local_max_bits = code_lengths[k];
            }
          }
          max_bits += local_max_bits;
        }
      }
      htree_group->is_trivial_literal = is_trivial_literal;
      htree_group->is_trivial_code = 0;
      if (is_trivial_literal) {
        const int red = htrees[RED][0].value;
        const int blue = htrees[BLUE][0].value;
        const int alpha = htrees[ALPHA][0].value;
        htree_group->literal_arb = ((uint32_t)alpha << 24) | (red << 16) | blue;
        if (total_size == 0 && htrees[GREEN][0].value < NUM_LITERAL_CODES) {
          htree_group->is_trivial_code = 1;
          htree_group->literal_arb |= htrees[GREEN][0].value << 8;
        }
      }
      htree_group->use_packed_table =
          !htree_group->is_trivial_code && (max_bits < HUFFMAN_PACKED_BITS);
      if (htree_group->use_packed_table) BuildPackedTable(htree_group);
    }
  }
  ok = 1;

  // All OK. Finalize pointers.
  hdr->huffman_image_ = huffman_image;
  hdr->num_htree_groups_ = num_htree_groups;
  hdr->htree_groups_ = htree_groups;
  hdr->huffman_tables_ = huffman_tables;

 Error:
  WebPSafeFree(code_lengths);
  WebPSafeFree(mapping);
  if (!ok) {
    WebPSafeFree(huffman_image);
    WebPSafeFree(huffman_tables);
    VP8LHtreeGroupsFree(htree_groups);
  }
  return ok;
}